

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O0

void hallucinatory_monster(int *a,wchar_t *c)

{
  monster_race *pmVar1;
  uint32_t uVar2;
  monster_race *race;
  wchar_t *c_local;
  int *a_local;
  
  do {
    pmVar1 = r_info;
    uVar2 = Rand_div((uint)z_info->r_max);
  } while (pmVar1[(int)uVar2].name == (char *)0x0);
  *a = (uint)monster_x_attr[pmVar1[(int)uVar2].ridx];
  *c = monster_x_char[pmVar1[(int)uVar2].ridx];
  return;
}

Assistant:

static void hallucinatory_monster(int *a, wchar_t *c)
{
	while (1) {
		/* Select a random monster */
		struct monster_race *race = &r_info[randint0(z_info->r_max)];
		
		/* Skip non-entries */
		if (!race->name) continue;
		
		/* Retrieve attr/char */
		*a = monster_x_attr[race->ridx];
		*c = monster_x_char[race->ridx];
		return;
	}
}